

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O2

Error __thiscall asmjit::X86RAPass::translate(X86RAPass *this)

{
  uint *puVar1;
  byte *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  ushort uVar5;
  CodeBuilder *pCVar6;
  CCFunc *pCVar7;
  CCFunc *pCVar8;
  CCFunc *pCVar9;
  long *plVar10;
  long lVar11;
  CBLabel *pCVar12;
  VirtReg *vreg;
  CBJump *jNode;
  void *pvVar13;
  CodeBuilder *pCVar14;
  RegOrder RVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  Error EVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CBLabel *pCVar20;
  undefined4 extraout_var_02;
  Link *pLVar21;
  CCFunc *pCVar22;
  long lVar23;
  CCFunc *jTarget;
  uint uVar24;
  long lVar25;
  uint uVar26;
  CBLabel *node;
  Link *pLVar27;
  X86Mem m;
  uint32_t local_114;
  uint32_t local_10c;
  X86CallAlloc cAlloc;
  X86VarAlloc vAlloc;
  
  pCVar6 = (this->super_RAPass).super_CBPass._cb;
  pCVar7 = (this->super_RAPass)._func;
  pCVar8 = (CCFunc *)(this->super_RAPass)._stop;
  pLVar27 = (this->super_RAPass)._jccList._first;
  pCVar22 = pCVar7;
  cAlloc.super_X86BaseAlloc._context = this;
  cAlloc.super_X86BaseAlloc._cc = (X86Compiler *)pCVar6;
  vAlloc.super_X86BaseAlloc._context = this;
  vAlloc.super_X86BaseAlloc._cc = (X86Compiler *)pCVar6;
LAB_0012ae65:
  uVar5 = (pCVar22->super_CBLabel).super_CBNode._flags;
  if ((uVar5 & 1) == 0) goto LAB_0012ae9b;
  if ((pCVar22->super_CBLabel).super_CBNode._type != '\x04') goto switchD_0012aed5_caseD_8;
  pCVar6->_cursor = (pCVar22->super_CBLabel).super_CBNode._prev;
  lVar23 = *(long *)((long)(pCVar22->super_CBLabel).super_CBNode._passData + 8);
LAB_0012ae8d:
  (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this,lVar23);
switchD_0012aed5_caseD_8:
  pLVar21 = pLVar27;
  do {
    if (pLVar21 == (Link *)0x0) {
      EVar19 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[10])(this);
      if (EVar19 != 0) {
        return EVar19;
      }
      (pCVar7->_frameInfo)._dirtyRegs[0] = (uint)(this->_clobberedRegs).field_0.field_0._gp;
      (pCVar7->_frameInfo)._dirtyRegs[2] = (uint)(this->_clobberedRegs).field_0.field_0._mm;
      (pCVar7->_frameInfo)._dirtyRegs[3] = (uint)(this->_clobberedRegs).field_0.field_0._k;
      (pCVar7->_frameInfo)._dirtyRegs[1] = (this->_clobberedRegs).field_0.field_0._vec;
      (pCVar7->_frameInfo)._stackFrameSize = (this->super_RAPass)._memAllTotal;
      uVar24 = (this->super_RAPass)._memMaxAlign;
      if (0xff < uVar24) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/../base/../base/../base/../base/func.h"
                   ,0x3e3,"value < 256");
      }
      (pCVar7->_frameInfo)._stackFrameAlignment = (uint8_t)uVar24;
      EVar19 = FuncFrameLayout::init((FuncFrameLayout *)&m,(EVP_PKEY_CTX *)&pCVar7->_funcDetail);
      if (EVar19 != 0) {
        return EVar19;
      }
      this->_varBaseRegId = m.super_Mem.super_Operand.super_Operand_.field_0._any.signature._1_1_;
      this->_varBaseOffset = local_114;
      pCVar14 = (this->super_RAPass).super_CBPass._cb;
      pCVar22 = pCVar7;
      do {
        if (((pCVar22->super_CBLabel).super_CBNode._type == '\x01') &&
           (bVar4 = *(byte *)((long)&(pCVar22->super_CBLabel)._id + 2), bVar4 != 0xff)) {
          RVar15 = (pCVar22->_funcDetail)._callConv._passedOrder[0];
          lVar23 = (ulong)bVar4 * 0x10;
          puVar1 = (uint *)((long)RVar15 + lVar23);
          uVar24 = *(uint *)((long)RVar15 + lVar23);
          if ((uVar24 >> 0xe & 1) != 0) {
            puVar1[2] = puVar1[2] + local_10c;
            uVar24 = uVar24 & 0xffffbfff;
            *puVar1 = uVar24;
          }
          if (((short)uVar24 < 0) && (uVar26 = puVar1[3], 0xff < uVar26)) {
            if (uVar26 == 0xffffffff) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/../base/codecompiler.h"
                         ,0x2a6,"id != kInvalidValue");
            }
            uVar16._0_4_ = pCVar14[1].super_CodeEmitter._privateData;
            uVar16._4_4_ = pCVar14[1].super_CodeEmitter._globalHints;
            if (uVar16 <= uVar26 - 0x100) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/../base/codecompiler.h"
                         ,0x2a9,"index < _vRegArray.getLength()");
            }
            lVar23 = *(long *)(*(long *)&pCVar14[1].super_CodeEmitter._type +
                              (ulong)(uVar26 - 0x100) * 8);
            if (lVar23 == 0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
                         ,0xe77,"vreg != nullptr");
            }
            lVar23 = *(long *)(lVar23 + 0x28);
            if (lVar23 == 0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
                         ,0xe7a,"cell != nullptr");
            }
            uVar26 = (pCVar14->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0.
                     _any.signature & 0xf8;
            bVar4 = this->_varBaseRegId;
            *puVar1 = uVar24 & 0xffffff07 | uVar26;
            puVar1[3] = (uint)bVar4;
            puVar1[2] = puVar1[2] + *(int *)(lVar23 + 8) + this->_varBaseOffset;
            *puVar1 = uVar24 & 0xffff7f07 | uVar26;
          }
        }
        pCVar22 = (CCFunc *)(pCVar22->super_CBLabel).super_CBNode._next;
        if (pCVar22 == pCVar8) {
          pCVar6->_cursor = (CBNode *)pCVar7;
          EVar19 = FuncUtils::emitProlog
                             (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                              (FuncFrameLayout *)&m);
          if (EVar19 != 0) {
            return EVar19;
          }
          pCVar6->_cursor = &pCVar7->_exitNode->super_CBNode;
          EVar19 = FuncUtils::emitEpilog
                             (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                              (FuncFrameLayout *)&m);
          return EVar19;
        }
      } while( true );
    }
    pLVar27 = pLVar21->_next;
    jNode = (CBJump *)pLVar21->_value;
    pCVar22 = *(CCFunc **)
               ((long)&(jNode->super_CBInst).super_CBNode +
               (ulong)(((jNode->super_CBInst).super_CBNode._flags & 0x40) == 0) * 0x40 + 8);
    (*(this->super_RAPass).super_CBPass._vptr_CBPass[6])
              (this,*(undefined8 *)((long)(jNode->super_CBInst).super_CBNode._passData + 8));
    pvVar13 = (pCVar22->super_CBLabel).super_CBNode._passData;
  } while (((pvVar13 != (void *)0x0) && (*(long *)((long)pvVar13 + 8) != 0)) &&
          (X86RAPass_translateJump(this,jNode,&pCVar22->super_CBLabel), pLVar21 = pLVar27,
          ((pCVar22->super_CBLabel).super_CBNode._flags & 1) != 0));
  uVar5 = (pCVar22->super_CBLabel).super_CBNode._flags;
LAB_0012ae9b:
  pCVar9 = (CCFunc *)(pCVar22->super_CBLabel).super_CBNode._next;
  pvVar13 = (pCVar22->super_CBLabel).super_CBNode._passData;
  (pCVar22->super_CBLabel).super_CBNode._flags = uVar5 | 1;
  jTarget = pCVar9;
  if (pvVar13 != (void *)0x0) goto code_r0x0012aeb6;
  goto switchD_0012aed5_caseD_2;
code_r0x0012aeb6:
  uVar3 = (pCVar22->super_CBLabel).super_CBNode._type;
  switch(uVar3) {
  case '\x01':
  case '\x10':
  case '\x12':
  case '\x13':
    if ((((uVar5 & 0x20) == 0) && (pCVar9 != (CCFunc *)0x0)) &&
       ((plVar10 = (long *)(pCVar9->super_CBLabel).super_CBNode._passData, plVar10 != (long *)0x0 &&
        (lVar23 = *plVar10, lVar23 != 0)))) {
      uVar24 = *(uint *)((long)pvVar13 + 0x10);
      for (lVar25 = 0; (ulong)uVar24 * 0x18 - lVar25 != 0; lVar25 = lVar25 + 0x18) {
        lVar11 = *(long *)((long)pvVar13 + lVar25 + 0x38);
        uVar26 = *(uint *)(lVar11 + 0x18);
        if (((*(ulong *)(lVar23 + (ulong)(uVar26 >> 6) * 8) >> ((ulong)uVar26 & 0x3f) & 1) == 0) &&
           ((*(byte *)(lVar11 + 0x17) & 1) == 0)) {
          pbVar2 = (byte *)((long)pvVar13 + lVar25 + 0x41);
          *pbVar2 = *pbVar2 | 0x10;
        }
      }
    }
    if (uVar3 == '\x12') {
      X86CallAlloc::run(&cAlloc,(CCFuncCall *)pCVar22);
      break;
    }
  case '\x11':
  case '\x14':
    X86VarAlloc::run(&vAlloc,(CBNode *)pCVar22);
    uVar5 = (pCVar22->super_CBLabel).super_CBNode._flags;
    if ((uVar5 & 0x30) == 0) {
      if ((char)uVar5 < '\0') {
        pCVar12 = pCVar7->_exitNode;
        pCVar14 = (this->super_RAPass).super_CBPass._cb;
        pCVar20 = (CBLabel *)(pCVar22->super_CBLabel).super_CBNode._next;
        pvVar13 = (pCVar22->super_CBLabel).super_CBNode._passData;
        if (pvVar13 != (void *)0x0) {
          uVar24 = *(uint *)((long)pvVar13 + 0x10);
          for (lVar23 = 0; (ulong)uVar24 * 0x18 != lVar23; lVar23 = lVar23 + 0x18) {
            if (0x3fffffff < *(uint *)((long)pvVar13 + lVar23 + 0x40)) {
              vreg = *(VirtReg **)((long)pvVar13 + lVar23 + 0x38);
              if (vreg->_memCell == (RACell *)0x0) {
                RAPass::_newVarCell(&this->super_RAPass,vreg);
              }
              m.super_Mem.super_Operand.super_Operand_.field_0._packed[0] =
                   (UInt64)((ulong)((((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter).
                                    _nativeGpReg.super_Operand.super_Operand_.field_0._any.signature
                                   & 0xf8) | 0xffffffff00008002);
              m.super_Mem.super_Operand.super_Operand_.field_0._mem.field_2 =
                   (anon_union_8_2_78723da6_for_MemData_2)((ulong)vreg->_id << 0x20);
              if ((long)(char)vreg->_typeId < 0) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../base/../base/../base/operand.h"
                           ,0x568,"typeId < ASMJIT_ARRAY_SIZE(_info.elementOf)");
              }
              if (TypeId::_info[(long)(char)vreg->_typeId + 0x80] == '*') {
                uVar26 = 0x4000000;
              }
              else if (TypeId::_info[(long)(char)vreg->_typeId + 0x80] == '+') {
                uVar26 = 0x8000000;
              }
              else {
                uVar26 = (uint)((*(byte *)((long)pvVar13 + lVar23 + 0x43) & 0x40) == 0) * 0x4000000
                         + 0x4000000;
              }
              uVar18 = m.super_Mem.super_Operand.super_Operand_.field_0._0_4_;
              m.super_Mem.super_Operand.super_Operand_.field_0._any.id = 0xffffffff;
              m.super_Mem.super_Operand.super_Operand_.field_0._any.signature = uVar18 | uVar26;
              CodeEmitter::emit(&pCVar14->super_CodeEmitter,0xc6,(Operand_ *)&m);
            }
          }
        }
        while( true ) {
          if (((pCVar20 == (CBLabel *)0x0) || (bVar4 = (pCVar20->super_CBNode)._type, bVar4 - 1 < 2)
              ) || (bVar4 - 0x11 < 2)) goto LAB_0012b253;
          if (bVar4 == 0x10) {
            return 4;
          }
          if (bVar4 == 8) goto switchD_0012aed5_caseD_2;
          if (bVar4 == 4) break;
          pCVar20 = (CBLabel *)(pCVar20->super_CBNode)._next;
        }
        if (pCVar20 == pCVar12) break;
LAB_0012b253:
        pCVar14->_cursor = (CBNode *)pCVar22;
        m.super_Mem.super_Operand.super_Operand_.field_0._packed[0] =
             (UInt64)((ulong)pCVar12->_id << 0x20 | 4);
        m.super_Mem.super_Operand.super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)0x0;
        CodeEmitter::emit(&pCVar14->super_CodeEmitter,0x11e,(Operand_ *)&m);
      }
    }
    else {
      jTarget = *(CCFunc **)(pCVar22->_funcDetail)._callConv._passedOrder[1].id;
      if (jTarget == (CCFunc *)0x0) {
        jTarget = pCVar9;
        if ((uVar5 & 0x10) != 0) goto switchD_0012aed5_caseD_8;
      }
      else if ((uVar5 & 0x10) == 0) {
        pCVar9 = (CCFunc *)(pCVar22->super_CBLabel).super_CBNode._next;
        uVar5 = (pCVar9->super_CBLabel).super_CBNode._flags;
        if (((jTarget->super_CBLabel).super_CBNode._flags & 1) == 0) {
          if ((uVar5 & 1) == 0) {
            iVar17 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
            *(ulong *)((long)(pCVar22->super_CBLabel).super_CBNode._passData + 8) =
                 CONCAT44(extraout_var,iVar17);
            if (((pCVar22->super_CBLabel).super_CBNode._flags & 0x40) == 0) {
              jTarget = (CCFunc *)(pCVar22->super_CBLabel).super_CBNode._next;
            }
            else {
              jTarget = *(CCFunc **)(pCVar22->_funcDetail)._callConv._passedOrder[1].id;
            }
          }
          else {
            if ((pCVar9->super_CBLabel).super_CBNode._type != '\x04') {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
                         ,0xf98,"jNext->getType() == CBNode::kNodeLabel");
            }
            iVar17 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
            *(ulong *)((long)(pCVar22->super_CBLabel).super_CBNode._passData + 8) =
                 CONCAT44(extraout_var_02,iVar17);
            pCVar6->_cursor = (CBNode *)pCVar22;
            (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])
                      (this,*(undefined8 *)
                             ((long)(pCVar9->super_CBLabel).super_CBNode._passData + 8));
          }
        }
        else {
          if ((uVar5 & 1) != 0) {
            if ((pCVar9->super_CBLabel).super_CBNode._type != '\x04') {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
                         ,0xf8a,"jNext->getType() == CBNode::kNodeLabel");
            }
            pCVar6->_cursor = (pCVar22->super_CBLabel).super_CBNode._prev;
            (*(this->super_RAPass).super_CBPass._vptr_CBPass[9])
                      (this,*(undefined8 *)
                             ((long)(jTarget->super_CBLabel).super_CBNode._passData + 8),
                       *(undefined8 *)((long)(pCVar9->super_CBLabel).super_CBNode._passData + 8));
          }
          iVar17 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
          *(ulong *)((long)(pCVar22->super_CBLabel).super_CBNode._passData + 8) =
               CONCAT44(extraout_var_01,iVar17);
          X86RAPass_translateJump(this,(CBJump *)pCVar22,&jTarget->super_CBLabel);
          jTarget = pCVar9;
        }
      }
      else {
        pvVar13 = (jTarget->super_CBLabel).super_CBNode._passData;
        if ((pvVar13 != (void *)0x0) && (lVar23 = *(long *)((long)pvVar13 + 8), lVar23 != 0))
        goto code_r0x0012b14e;
      }
    }
    break;
  case '\x04':
    if (*(long *)((long)pvVar13 + 8) != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
                 ,0xf40,"node->getPassData<RAData>()->state == nullptr");
    }
    iVar17 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
    *(ulong *)((long)(pCVar22->super_CBLabel).super_CBNode._passData + 8) =
         CONCAT44(extraout_var_00,iVar17);
    if (pCVar22 == (CCFunc *)pCVar7->_exitNode) goto switchD_0012aed5_caseD_8;
    break;
  case '\b':
    goto switchD_0012aed5_caseD_8;
  }
switchD_0012aed5_caseD_2:
  pCVar22 = jTarget;
  if (jTarget != pCVar8) goto LAB_0012ae65;
  goto switchD_0012aed5_caseD_8;
code_r0x0012b14e:
  pCVar6->_cursor = (pCVar22->super_CBLabel).super_CBNode._prev;
  goto LAB_0012ae8d;
}

Assistant:

Error X86RAPass::translate() {
  X86Compiler* cc = this->cc();
  CCFunc* func = getFunc();

  // Register allocator contexts.
  X86VarAlloc vAlloc(this);
  X86CallAlloc cAlloc(this);

  // Flow.
  CBNode* node_ = func;
  CBNode* next = nullptr;
  CBNode* stop = getStop();

  ZoneList<CBNode*>::Link* jLink = _jccList.getFirst();

  for (;;) {
    while (node_->isTranslated()) {
      // Switch state if we went to a node that is already translated.
      if (node_->getType() == CBNode::kNodeLabel) {
        CBLabel* node = static_cast<CBLabel*>(node_);
        cc->_setCursor(node->getPrev());
        switchState(node->getPassData<RAData>()->state);
      }

_NextGroup:
      if (!jLink) {
        goto _Done;
      }
      else {
        node_ = jLink->getValue();
        jLink = jLink->getNext();

        CBNode* jFlow = X86RAPass_getOppositeJccFlow(static_cast<CBJump*>(node_));
        loadState(node_->getPassData<RAData>()->state);

        if (jFlow->hasPassData() && jFlow->getPassData<RAData>()->state) {
          X86RAPass_translateJump(this, static_cast<CBJump*>(node_), static_cast<CBLabel*>(jFlow));

          node_ = jFlow;
          if (node_->isTranslated())
            goto _NextGroup;
        }
        else {
          node_ = jFlow;
        }

        break;
      }
    }

    next = node_->getNext();
    node_->_flags |= CBNode::kFlagIsTranslated;

    if (node_->hasPassData()) {
      switch (node_->getType()) {
        // --------------------------------------------------------------------
        // [Align / Embed]
        // --------------------------------------------------------------------

        case CBNode::kNodeAlign:
        case CBNode::kNodeData:
          break;

        // --------------------------------------------------------------------
        // [Label]
        // --------------------------------------------------------------------

        case CBNode::kNodeLabel: {
          CBLabel* node = static_cast<CBLabel*>(node_);
          ASMJIT_ASSERT(node->getPassData<RAData>()->state == nullptr);
          node->getPassData<RAData>()->state = saveState();

          if (node == func->getExitNode())
            goto _NextGroup;
          break;
        }

        // --------------------------------------------------------------------
        // [Inst/Call/SArg/Ret]
        // --------------------------------------------------------------------

        case CBNode::kNodeInst:
        case CBNode::kNodeFunc:
        case CBNode::kNodeFuncCall:
        case CBNode::kNodePushArg:
          // Update TiedReg's unuse flags based on liveness of the next node.
          if (!node_->isJcc()) {
            X86RAData* raData = node_->getPassData<X86RAData>();
            RABits* liveness;

            if (raData && next && next->hasPassData() && (liveness = next->getPassData<RAData>()->liveness)) {
              TiedReg* tiedArray = raData->tiedArray;
              uint32_t tiedTotal = raData->tiedTotal;

              for (uint32_t i = 0; i < tiedTotal; i++) {
                TiedReg* tied = &tiedArray[i];
                VirtReg* vreg = tied->vreg;

                if (!liveness->getBit(vreg->_raId) && !vreg->isFixed())
                  tied->flags |= TiedReg::kUnuse;
              }
            }
          }

          if (node_->getType() == CBNode::kNodeFuncCall) {
            ASMJIT_PROPAGATE(cAlloc.run(static_cast<CCFuncCall*>(node_)));
            break;
          }
          ASMJIT_FALLTHROUGH;

        case CBNode::kNodeHint:
        case CBNode::kNodeFuncExit: {
          ASMJIT_PROPAGATE(vAlloc.run(node_));

          // Handle conditional/unconditional jump.
          if (node_->isJmpOrJcc()) {
            CBJump* node = static_cast<CBJump*>(node_);
            CBLabel* jTarget = node->getTarget();

            // Target not followed.
            if (!jTarget) {
              if (node->isJmp())
                goto _NextGroup;
              else
                break;
            }

            if (node->isJmp()) {
              if (jTarget->hasPassData() && jTarget->getPassData<RAData>()->state) {
                cc->_setCursor(node->getPrev());
                switchState(jTarget->getPassData<RAData>()->state);

                goto _NextGroup;
              }
              else {
                next = jTarget;
              }
            }
            else {
              CBNode* jNext = node->getNext();

              if (jTarget->isTranslated()) {
                if (jNext->isTranslated()) {
                  ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);
                  cc->_setCursor(node->getPrev());
                  intersectStates(
                    jTarget->getPassData<RAData>()->state,
                    jNext->getPassData<RAData>()->state);
                }

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                X86RAPass_translateJump(this, node, jTarget);
                next = jNext;
              }
              else if (jNext->isTranslated()) {
                ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                cc->_setCursor(node);
                switchState(jNext->getPassData<RAData>()->state);
                next = jTarget;
              }
              else {
                node->getPassData<RAData>()->state = saveState();
                next = X86RAPass_getJccFlow(node);
              }
            }
          }
          else if (node_->isRet()) {
            ASMJIT_PROPAGATE(
              X86RAPass_translateRet(this, static_cast<CCFuncRet*>(node_), func->getExitNode()));
          }
          break;
        }

        // --------------------------------------------------------------------
        // [End]
        // --------------------------------------------------------------------

        case CBNode::kNodeSentinel: {
          goto _NextGroup;
        }

        default:
          break;
      }
    }

    if (next == stop)
      goto _NextGroup;
    node_ = next;
  }

_Done:
  {
    ASMJIT_PROPAGATE(resolveCellOffsets());
    ASMJIT_PROPAGATE(X86RAPass_prepareFuncFrame(this, func));

    FuncFrameLayout layout;
    ASMJIT_PROPAGATE(layout.init(func->getDetail(), func->getFrameInfo()));

    _varBaseRegId = layout._stackBaseRegId;
    _varBaseOffset = layout._stackBaseOffset;

    ASMJIT_PROPAGATE(X86RAPass_patchFuncMem(this, func, stop, layout));

    cc->_setCursor(func);
    ASMJIT_PROPAGATE(FuncUtils::emitProlog(this->cc(), layout));

    cc->_setCursor(func->getExitNode());
    ASMJIT_PROPAGATE(FuncUtils::emitEpilog(this->cc(), layout));
  }

  return kErrorOk;
}